

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

edge_t_conflict
create_edge(gen_ctx_t gen_ctx,bb_t_conflict src,bb_t_conflict dst,int fall_through_p,int append_p)

{
  in_edge_t peVar1;
  out_edge_t peVar2;
  bitmap_t bm;
  ulong uVar3;
  ulong uVar4;
  edge_t_conflict peVar5;
  edge_t_conflict extraout_RAX;
  DLIST_in_edge_t *pDVar6;
  DLIST_out_edge_t *pDVar7;
  DLIST_LINK_out_edge_t *pDVar8;
  uint uVar9;
  bb_t_conflict pbVar10;
  ulong *nb;
  undefined8 *puVar11;
  bitmap_t pVVar12;
  DLIST_out_edge_t *pDVar13;
  DLIST_LINK_in_edge_t *pDVar14;
  
  puVar11 = (undefined8 *)&DAT_00000038;
  pbVar10 = src;
  peVar5 = (edge_t_conflict)malloc(0x38);
  uVar9 = (uint)pbVar10;
  if (peVar5 == (edge_t_conflict)0x0) {
    util_error(gen_ctx,"no memory");
  }
  peVar5->src = src;
  peVar5->dst = dst;
  pDVar6 = &dst->in_edges;
  if (append_p == 0) {
    peVar1 = pDVar6->head;
    if (peVar1 != (in_edge_t)0x0) {
      if ((peVar1->in_link).prev != (in_edge_t)0x0) goto LAB_0015f352;
      pDVar14 = &peVar1->in_link;
LAB_0015f2da:
      pDVar14->prev = peVar5;
      (peVar5->in_link).prev = (in_edge_t)0x0;
      (peVar5->in_link).next = peVar1;
      pDVar6->head = peVar5;
      peVar2 = (src->out_edges).head;
      if (peVar2 == (out_edge_t)0x0) {
        if ((src->out_edges).tail != (out_edge_t)0x0) goto LAB_0015f36b;
        pDVar8 = (DLIST_LINK_out_edge_t *)&(src->out_edges).tail;
LAB_0015f30d:
        pDVar13 = &src->out_edges;
        pDVar8->prev = peVar5;
        (peVar5->out_link).prev = (out_edge_t)0x0;
        (peVar5->out_link).next = peVar2;
        goto LAB_0015f320;
      }
      if ((peVar2->out_link).prev == (out_edge_t)0x0) {
        pDVar8 = &peVar2->out_link;
        goto LAB_0015f30d;
      }
      goto LAB_0015f361;
    }
    if ((dst->in_edges).tail == (in_edge_t_conflict)0x0) {
      pDVar14 = (DLIST_LINK_in_edge_t *)&(dst->in_edges).tail;
      goto LAB_0015f2da;
    }
  }
  else {
    peVar1 = (dst->in_edges).tail;
    if (peVar1 == (in_edge_t)0x0) {
      if (pDVar6->head == (in_edge_t_conflict)0x0) goto LAB_0015f27a;
LAB_0015f357:
      create_edge_cold_2();
    }
    else {
      if ((peVar1->in_link).next != (in_edge_t)0x0) {
        create_edge_cold_1();
LAB_0015f34d:
        create_edge_cold_3();
LAB_0015f352:
        create_edge_cold_5();
        goto LAB_0015f357;
      }
      pDVar6 = (DLIST_in_edge_t *)&(peVar1->in_link).next;
LAB_0015f27a:
      pDVar6->head = peVar5;
      (peVar5->in_link).next = (in_edge_t)0x0;
      (peVar5->in_link).prev = peVar1;
      (dst->in_edges).tail = peVar5;
      peVar2 = (src->out_edges).tail;
      if (peVar2 != (out_edge_t)0x0) {
        if ((peVar2->out_link).next != (out_edge_t)0x0) goto LAB_0015f34d;
        pDVar7 = (DLIST_out_edge_t *)&(peVar2->out_link).next;
LAB_0015f2b6:
        pDVar13 = (DLIST_out_edge_t *)&(src->out_edges).tail;
        pDVar7->head = peVar5;
        (peVar5->out_link).next = (out_edge_t)0x0;
        (peVar5->out_link).prev = peVar2;
LAB_0015f320:
        pDVar13->head = peVar5;
        peVar5->fall_through_p = (uchar)fall_through_p;
        peVar5->flag2 = '\0';
        peVar5->back_edge_p = '\0';
        peVar5->flag1 = '\0';
        return peVar5;
      }
      if ((src->out_edges).head == (out_edge_t)0x0) {
        pDVar7 = &src->out_edges;
        goto LAB_0015f2b6;
      }
    }
    create_edge_cold_4();
LAB_0015f361:
    create_edge_cold_7();
  }
  create_edge_cold_6();
LAB_0015f36b:
  create_edge_cold_8();
  if (uVar9 < 0x22) {
    __assert_fail("reg > ST1_HARD_REG",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x5f3,"void update_tied_regs(gen_ctx_t, MIR_reg_t)");
  }
  peVar5 = extraout_RAX;
  if (uVar9 != 0xffffffff) {
    peVar5 = (edge_t_conflict)
             MIR_reg_hard_reg_name
                       ((MIR_context_t)*puVar11,uVar9 - 0x21,*(MIR_func_t *)(puVar11[2] + 0x40));
    if (peVar5 != (edge_t_conflict)0x0) {
      bm = (bitmap_t)puVar11[7];
      nb = (ulong *)((ulong)uVar9 + 1);
      pVVar12 = bm;
      bitmap_expand(bm,(size_t)nb);
      if (bm == (bitmap_t)0x0) {
        update_tied_regs_cold_1();
        uVar3 = pVVar12->els_num;
        if ((*(int *)(uVar3 + 0x18) == 0xb4) && (uVar4 = *nb, *(int *)(uVar4 + 0x18) == 0xb4)) {
          peVar5 = (edge_t_conflict)0xffffffff;
          if (uVar4 <= uVar3) {
            peVar5 = (edge_t_conflict)(ulong)(uVar3 != uVar4);
          }
          return peVar5;
        }
        __assert_fail("lab1->code == MIR_LABEL && lab2->code == MIR_LABEL",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x60c,"int label_cmp(const void *, const void *)");
      }
      peVar5 = (edge_t_conflict)bm->varr;
      (&peVar5->src)[uVar9 >> 6] =
           (bb_t)((ulong)(&peVar5->src)[uVar9 >> 6] | 1L << ((ulong)uVar9 & 0x3f));
    }
  }
  return peVar5;
}

Assistant:

static edge_t create_edge (gen_ctx_t gen_ctx, bb_t src, bb_t dst, int fall_through_p,
                           int append_p) {
  edge_t e = gen_malloc (gen_ctx, sizeof (struct edge));

  e->src = src;
  e->dst = dst;
  if (append_p) {
    DLIST_APPEND (in_edge_t, dst->in_edges, e);
    DLIST_APPEND (out_edge_t, src->out_edges, e);
  } else {
    DLIST_PREPEND (in_edge_t, dst->in_edges, e);
    DLIST_PREPEND (out_edge_t, src->out_edges, e);
  }
  e->fall_through_p = fall_through_p;
  e->back_edge_p = e->flag1 = e->flag2 = FALSE;
  return e;
}